

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O1

bool __thiscall
wasm::CodeFolding::optimizeTerminatingTails
          (CodeFolding *this,
          vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *tails,Index num
          )

{
  int iVar1;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  __last;
  pointer pTVar2;
  iterator __position;
  pointer ppEVar3;
  pointer ppEVar4;
  uintptr_t uVar5;
  Module *pMVar6;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_CodeFolding_cpp:657:42)>
  __pred;
  bool bVar7;
  __normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
  _Var8;
  pointer pTVar9;
  ulong uVar10;
  Expression *pEVar11;
  mapped_type *pmVar12;
  vector<wasm::Expression*,std::allocator<wasm::Expression*>> *this_00;
  pointer pTVar13;
  mapped_type *pmVar14;
  long lVar15;
  __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  _Var16;
  pointer ppEVar17;
  Break *pBVar18;
  Block *pBVar19;
  Block *pBVar20;
  Block *pBVar21;
  int iVar22;
  ulong uVar23;
  iterator __begin3;
  uint uVar24;
  iterator __end3;
  Tail *pTVar25;
  MixedArena *pMVar26;
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar27;
  string_view sVar28;
  Signature SVar29;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_CodeFolding_cpp:638:28)>
  __pred_00;
  undefined1 local_298 [8];
  LabelManager labels;
  pointer local_180;
  anon_class_8_1_7edb1669 getTailItems;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> seen;
  anon_class_16_2_c54e8edd worthIt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  pointer local_118;
  anon_class_8_1_b991b068 getItem;
  Expression *item_1;
  value_type first;
  Expression *correct;
  mapped_type hash;
  value_type *local_e8;
  Expression **local_e0;
  mapped_type digest;
  undefined1 local_d0 [8];
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> explore;
  undefined1 auStack_a8 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> others;
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> next;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> mergeable;
  uint local_34;
  anon_class_1_0_00000001 effectiveSize;
  Index num_local;
  
  _Var8._M_current =
       (tails->super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (tails->super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)(((long)__last._M_current - (long)_Var8._M_current >> 3) * -0x5555555555555555) < 2) {
    return false;
  }
  local_34 = num;
  _Var8 = std::
          __remove_if<__gnu_cxx::__normal_iterator<wasm::CodeFolding::Tail*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>,__gnu_cxx::__ops::_Iter_pred<wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::CodeFolding::Tail&)_1_>>
                    (_Var8,__last,
                     (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_CodeFolding_cpp:509:22)>
                      )this);
  pTVar25 = (tails->
            super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if ((_Var8._M_current != pTVar25) &&
     (pTVar2 = (tails->
               super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
               )._M_impl.super__Vector_impl_data._M_finish,
     pTVar9 = (pointer)((long)_Var8._M_current + ((long)pTVar2 - (long)pTVar25)), pTVar2 != pTVar9))
  {
    (tails->super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>).
    _M_impl.super__Vector_impl_data._M_finish = pTVar9;
  }
  seen._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&local_180;
  local_180 = (pointer)&stack0xfffffffffffffee8;
  worthIt.getTailItems = (anon_class_8_1_7edb1669 *)this;
  local_118 = (pointer)&stack0xffffffffffffffcb;
  std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::vector
            ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
             &others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,tails);
  pTVar2 = next.
           super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
           _M_impl.super__Vector_impl_data._M_start;
  labels.
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .replacep = (Expression **)&stack0xffffffffffffffcc;
  local_298 = (undefined1  [8])&stack0xffffffffffffffcb;
  labels.
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .stack.usedFixed = (size_t)&stack0xfffffffffffffee8;
  labels.
  super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .
  super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
  .stack.fixed._M_elems[0].func = (TaskFunc)this;
  next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffffcb;
  mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       labels.
       super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
       .
       super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
       .replacep;
  mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&stack0xfffffffffffffee8;
  mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<wasm::CodeFolding::Tail*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>,__gnu_cxx::__ops::_Iter_pred<wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::CodeFolding::Tail&)_3_>>
                    (others.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     next.
                     super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  pTVar25 = _Var8._M_current + 1;
  explore.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tails;
  if (pTVar25 != pTVar2 && _Var8._M_current != pTVar2) {
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodeFolding.cpp:585:31)>
              ::anon_class_32_4_ee1ba314_for__M_pred::operator()
                        ((anon_class_32_4_ee1ba314_for__M_pred *)local_298,pTVar25);
      if (!bVar7) {
        (_Var8._M_current)->pointer = pTVar25->pointer;
        pBVar21 = pTVar25->block;
        (_Var8._M_current)->expr = pTVar25->expr;
        (_Var8._M_current)->block = pBVar21;
        _Var8._M_current = _Var8._M_current + 1;
      }
      pTVar25 = pTVar25 + 1;
    } while (pTVar25 != pTVar2);
  }
  if ((_Var8._M_current !=
       next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     (next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
      _M_impl.super__Vector_impl_data._M_start != _Var8._M_current)) {
    next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
    _M_impl.super__Vector_impl_data._M_start = _Var8._M_current;
  }
  pTVar2 = next.
           super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)next.
                         super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                         ._M_impl.super__Vector_impl_data._M_start -
                   (long)others.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                 -0x5555555555555555)) {
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .stack.fixed._M_elems[0].func = (TaskFunc)&labels;
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .replacep = (Expression **)
                ((ulong)labels.
                        super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                        .
                        super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                        .replacep & 0xffffffff00000000);
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .stack.usedFixed = 0;
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .stack.fixed._M_elems[1].func = (TaskFunc)0x0;
    mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&mergeable;
    mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)mergeable.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    labels.
    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .
    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
    .stack.fixed._M_elems[0].currp =
         (Expression **)
         labels.
         super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
         .
         super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
         .stack.fixed._M_elems[0].func;
    if ((pointer)others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage !=
        next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pTVar9 = (pointer)others.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pBVar21 = pTVar9->block;
        pTVar13 = pTVar9;
        if (pBVar21 != (Block *)0x0) {
          uVar23 = (pBVar21->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                   usedElements;
          uVar10 = (ulong)(~local_34 + (int)uVar23);
          if (uVar23 <= uVar10) goto LAB_006a6295;
          pTVar13 = (pointer)((pBVar21->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .data + uVar10);
        }
        getTailItems.getItem = (anon_class_8_1_b991b068 *)pTVar13->expr;
        pEVar11 = (Expression *)ExpressionAnalyzer::hash((Expression *)getTailItems.getItem);
        pmVar12 = std::
                  map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                  ::operator[]((map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                                *)local_298,(key_type *)&getTailItems);
        *pmVar12 = (mapped_type)pEVar11;
        correct = pEVar11;
        this_00 = (vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                  std::
                  map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                  ::operator[]((map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                                *)&next.
                                   super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (key_type_conflict *)&correct);
        __position._M_current = *(Expression ***)(this_00 + 8);
        if (__position._M_current == *(Expression ***)(this_00 + 0x10)) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    (this_00,__position,(Expression **)&getTailItems);
        }
        else {
          *__position._M_current = (Expression *)getTailItems.getItem;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != pTVar2);
    }
    pTVar2 = next.
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
             _M_impl.super__Vector_impl_data._M_start;
    seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&seen;
    seen._M_t._M_impl._0_4_ = 0;
    seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    seen._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((pointer)others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage ==
        next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&getTailItems);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                   *)&next.
                      super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Expression_*const,_unsigned_long>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Expression_*const,_unsigned_long>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                   *)local_298);
    }
    else {
      pTVar9 = (pointer)others.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pBVar21 = pTVar9->block;
        pTVar13 = pTVar9;
        if (pBVar21 != (Block *)0x0) {
          uVar23 = (pBVar21->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                   usedElements;
          uVar10 = (ulong)(~local_34 + (int)uVar23);
          if (uVar23 <= uVar10) goto LAB_006a6295;
          pTVar13 = (pointer)((pBVar21->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              .data + uVar10);
        }
        getItem.effectiveSize = (anon_class_1_0_00000001 *)pTVar13->expr;
        pmVar12 = std::
                  map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                  ::operator[]((map<wasm::Expression_*,_unsigned_long,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                                *)local_298,(key_type *)&getItem);
        local_e0 = (Expression **)*pmVar12;
        pVar27 = std::
                 _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                 ::_M_emplace_unique<unsigned_long&>
                           ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                             *)&getTailItems,(unsigned_long *)&local_e0);
        uVar24 = 5;
        if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pmVar14 = std::
                    map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                    ::operator[]((map<unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                                  *)&next.
                                     super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (key_type_conflict *)&local_e0);
          lVar15 = (long)(pmVar14->
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar14->
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3;
          if (lVar15 != 1) {
            if (lVar15 == 0) {
              __assert_fail("items.size() > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/CodeFolding.cpp"
                            ,0x276,
                            "bool wasm::CodeFolding::optimizeTerminatingTails(std::vector<Tail> &, Index)"
                           );
            }
            ppEVar17 = (pmVar14->
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            uVar23 = (long)(pmVar14->
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar17;
            while (uVar24 = 0, 8 < uVar23) {
              item_1 = *ppEVar17;
              auStack_a8 = (undefined1  [8])0x0;
              others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              __pred_00._M_pred.others =
                   (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_a8;
              __pred_00._M_pred.first = &item_1;
              _Var16 = std::
                       __remove_if<__gnu_cxx::__normal_iterator<wasm::Expression**,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>,__gnu_cxx::__ops::_Iter_pred<wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::Expression*)_1_>>
                                 ((__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                   )(pmVar14->
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start,
                                  (__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                   )(pmVar14->
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish,__pred_00);
              ppEVar17 = (pmVar14->
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              if ((_Var16._M_current != ppEVar17) &&
                 (ppEVar3 = (pmVar14->
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish,
                 ppEVar17 = (pointer)((long)_Var16._M_current + ((long)ppEVar3 - (long)ppEVar17)),
                 ppEVar3 != ppEVar17)) {
                (pmVar14->
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl
                .super__Vector_impl_data._M_finish = ppEVar17;
              }
              ppEVar17 = (pmVar14->
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              if (8 < (ulong)((long)(pmVar14->
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar17)) {
                first = *ppEVar17;
                std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::
                vector((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                       local_d0,(vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                 *)&others.
                                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                correct = (Expression *)&stack0xfffffffffffffee8;
                hash = (mapped_type)&stack0xffffffffffffffcc;
                local_e8 = &first;
                __pred._M_pred.num._0_4_ = (int)hash;
                __pred._M_pred.getItem = (anon_class_8_1_b991b068 *)correct;
                __pred._M_pred.num._4_4_ = (int)(hash >> 0x20);
                __pred._M_pred.correct._0_4_ = (int)local_e8;
                __pred._M_pred.correct._4_4_ = (int)((ulong)local_e8 >> 0x20);
                _Var8 = std::
                        __remove_if<__gnu_cxx::__normal_iterator<wasm::CodeFolding::Tail*,std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>>,__gnu_cxx::__ops::_Iter_pred<wasm::CodeFolding::optimizeTerminatingTails(std::vector<wasm::CodeFolding::Tail,std::allocator<wasm::CodeFolding::Tail>>&,unsigned_int)::_lambda(wasm::CodeFolding::Tail&)_4_>>
                                  ((__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                                    )local_d0,
                                   (__normal_iterator<wasm::CodeFolding::Tail_*,_std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>_>
                                    )explore.
                                     super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                     ._M_impl.super__Vector_impl_data._M_start,__pred);
                if ((_Var8._M_current !=
                     explore.
                     super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                     ._M_impl.super__Vector_impl_data._M_start) &&
                   (explore.
                    super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                    ._M_impl.super__Vector_impl_data._M_start != _Var8._M_current)) {
                  explore.
                  super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var8;
                }
                bVar7 = optimizeTerminatingTails
                                  (this,(vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                         *)local_d0,local_34 + 1);
                if (local_d0 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_d0,
                                  (long)explore.
                                        super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_d0)
                  ;
                }
                if (bVar7) {
                  if (auStack_a8 != (undefined1  [8])0x0) {
                    operator_delete((void *)auStack_a8,
                                    (long)others.
                                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)auStack_a8);
                  }
                  uVar24 = 1;
                  break;
                }
              }
              ppEVar17 = (pmVar14->
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              ppEVar3 = (pmVar14->
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish;
              ppEVar4 = (pmVar14->
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (pmVar14->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
              ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_a8;
              (pmVar14->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
              ._M_impl.super__Vector_impl_data._M_finish =
                   others.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              (pmVar14->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   others.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              auStack_a8 = (undefined1  [8])ppEVar17;
              others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start = ppEVar3;
              others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppEVar4;
              if (ppEVar17 != (pointer)0x0) {
                operator_delete(ppEVar17,(long)ppEVar4 - (long)ppEVar17);
              }
              ppEVar17 = (pmVar14->
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              uVar23 = (long)(pmVar14->
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar17;
            }
          }
        }
        if ((uVar24 != 5) && (uVar24 != 0)) goto LAB_006a5d4f;
        pTVar9 = pTVar9 + 1;
      } while (pTVar9 != pTVar2);
      uVar24 = 0;
LAB_006a5d4f:
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&getTailItems);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                   *)&next.
                      super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Expression_*const,_unsigned_long>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Expression_*const,_unsigned_long>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_long>_>_>
                   *)local_298);
      bVar7 = true;
      if ((uVar24 & 3) != 0) goto LAB_006a624a;
    }
  }
  if ((local_34 == 0) ||
     (bVar7 = optimizeTerminatingTails::anon_class_16_2_c54e8edd::operator()
                        ((anon_class_16_2_c54e8edd *)
                         &seen._M_t._M_impl.super__Rb_tree_header._M_node_count,local_34,
                         (vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          *)explore.
                            super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar24 = local_34,
     !bVar7)) {
    bVar7 = false;
  }
  else {
    next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_34 != 0) {
      iVar22 = -1;
      do {
        pEVar11 = (explore.
                   super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->expr;
        uVar5 = (pEVar11->type).id;
        if (uVar5 != 0) {
          uVar23 = (ulong)(uint)(iVar22 + (int)*(ulong *)(uVar5 + 0x28));
          if (*(ulong *)(uVar5 + 0x28) <= uVar23) {
LAB_006a6295:
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          pEVar11 = (Expression *)(uVar23 * 8 + *(long *)(uVar5 + 0x20));
        }
        local_298 = *(undefined1 (*) [8])pEVar11;
        if (mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                     &next.
                      super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (iterator)
                     mergeable.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,(Expression **)local_298);
        }
        else {
          *mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
           _M_impl.super__Vector_impl_data._M_start = (Expression *)local_298;
          mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        iVar1 = uVar24 + iVar22;
        iVar22 = iVar22 + -1;
      } while (iVar1 != 0);
    }
    this->anotherPass = true;
    pMVar6 = (this->
             super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
             ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
             super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
             super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.currModule;
    LabelUtils::LabelManager::LabelManager
              ((LabelManager *)local_298,
               (this->
               super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
               ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
               .super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
               super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.currFunction
              );
    worthIt.this = (CodeFolding *)&local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&worthIt.this,"folding-inner","");
    pTVar2 = explore.
             super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar28 = (string_view)
             LabelUtils::LabelManager::getUnique((LabelManager *)local_298,(string *)&worthIt.this);
    digest = (mapped_type)pMVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)worthIt.this != &local_128) {
      operator_delete(worthIt.this,local_128._M_allocated_capacity + 1);
    }
    pBVar21 = (Block *)pTVar2->expr;
    pBVar19 = pTVar2->block;
    if (pBVar21 != pBVar19) {
      pMVar26 = (MixedArena *)(digest + 0x158);
      do {
        pEVar11 = (Expression *)
                  (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type
                  .id;
        if (pEVar11 == (Expression *)0x0) {
          markAsModified(this,*(Expression **)
                               &(pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).
                                super_Expression);
          pBVar18 = (Break *)MixedArena::allocSpace(pMVar26,0x30,8);
          (pBVar18->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id =
               BreakId;
          (pBVar18->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
          (pBVar18->name).super_IString.str._M_len = 0;
          (pBVar18->name).super_IString.str._M_str = (char *)0x0;
          pBVar18->value = (Expression *)0x0;
          pBVar18->condition = (Expression *)0x0;
          (pBVar18->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
          (pBVar18->name).super_IString.str = sVar28;
          pBVar18->value = (Expression *)0x0;
          pBVar18->condition = (Expression *)0x0;
          Break::finalize(pBVar18);
          *(Break **)(pBVar21->name).super_IString.str._M_len = pBVar18;
        }
        else {
          markAsModified(this,pEVar11);
          if ((long)mergeable.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start -
              (long)next.
                    super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
            uVar5 = (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                    type.id;
            lVar15 = *(long *)(uVar5 + 0x28);
            uVar24 = 1;
            do {
              lVar15 = lVar15 + -1;
              if (lVar15 == -1) {
                __assert_fail("usedElements > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                              ,0xd5,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::pop_back() [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              *(long *)(uVar5 + 0x28) = lVar15;
              uVar23 = (ulong)uVar24;
              uVar24 = uVar24 + 1;
            } while (uVar23 < (ulong)((long)mergeable.
                                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                      (long)next.
                                            super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3)
                    );
          }
          uVar5 = (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type
                  .id;
          pBVar18 = (Break *)MixedArena::allocSpace(pMVar26,0x30,8);
          (pBVar18->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id =
               BreakId;
          (pBVar18->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
          (pBVar18->name).super_IString.str._M_len = 0;
          (pBVar18->name).super_IString.str._M_str = (char *)0x0;
          pBVar18->value = (Expression *)0x0;
          pBVar18->condition = (Expression *)0x0;
          (pBVar18->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
          (pBVar18->name).super_IString.str = sVar28;
          pBVar18->value = (Expression *)0x0;
          pBVar18->condition = (Expression *)0x0;
          Break::finalize(pBVar18);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (uVar5 + 0x20),(Expression *)pBVar18);
          pBVar20 = (Block *)(pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).
                             super_Expression.type.id;
          Block::finalize(pBVar20,(Type)(pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>)
                                        .super_Expression.type.id);
        }
        pBVar21 = (Block *)&(pBVar21->name).super_IString.str._M_str;
      } while (pBVar21 != pBVar19);
    }
    pBVar21 = (Block *)((this->
                        super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                        ).
                        super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                        .
                        super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                        .super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
                       currFunction)->body;
    pMVar26 = (MixedArena *)(digest + 0x158);
    pBVar19 = (Block *)MixedArena::allocSpace(pMVar26,0x40,8);
    (pBVar19->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
    (pBVar19->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    (pBVar19->name).super_IString.str._M_len = 0;
    (pBVar19->name).super_IString.str._M_str = (char *)0x0;
    (pBVar19->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
         = (Expression **)0x0;
    (pBVar19->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (pBVar19->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    (pBVar19->list).allocator = pMVar26;
    (pBVar19->name).super_IString.str = sVar28;
    uVar5 = (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
    if (uVar5 == 0) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar19->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pBVar21);
      pEVar11 = (Expression *)MixedArena::allocSpace(pMVar26,0x18,8);
      pEVar11->_id = ReturnId;
      (pEVar11->type).id = 0;
      *(undefined8 *)(pEVar11 + 1) = 0;
      (pEVar11->type).id = 1;
      *(undefined8 *)(pEVar11 + 1) = 0;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar19->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar11
                );
    }
    else if (uVar5 == 1) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar19->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pBVar21);
    }
    else {
      if ((pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
          BlockId) {
        Block::finalize(pBVar21);
      }
      pBVar20 = pBVar21;
      if ((pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id != 1
         ) {
        pBVar20 = (Block *)MixedArena::allocSpace(pMVar26,0x18,8);
        (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = ReturnId
        ;
        (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
        (pBVar20->name).super_IString.str._M_len = 0;
        (pBVar20->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
        (pBVar20->name).super_IString.str._M_len = (size_t)pBVar21;
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar19->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pBVar20);
    }
    Block::finalize(pBVar19);
    pBVar21 = (Block *)MixedArena::allocSpace(pMVar26,0x40,8);
    (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
    (pBVar21->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    (pBVar21->name).super_IString.str._M_len = 0;
    (pBVar21->name).super_IString.str._M_str = (char *)0x0;
    (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
         = (Expression **)0x0;
    (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (pBVar21->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    (pBVar21->list).allocator = pMVar26;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(pBVar21->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pBVar19);
    if (next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)mergeable.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start) {
      do {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar21->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   mergeable.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[-1]);
        mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             mergeable.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_start + -1;
      } while (next.
               super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage !=
               (pointer)mergeable.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    }
    SVar29 = HeapType::getSignature
                       (&((this->
                          super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
                          ).
                          super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                          .
                          super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>
                          .super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
                         currFunction)->type);
    Block::finalize(pBVar21,SVar29.results.id);
    ((this->
     super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>_>
     ).super_ControlFlowWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
     super_PostWalker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.
     super_Walker<wasm::CodeFolding,_wasm::Visitor<wasm::CodeFolding,_void>_>.currFunction)->body =
         (Expression *)pBVar21;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&labels.
                    super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                    .
                    super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                    .currModule);
    if (labels.
        super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
        .
        super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
        .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
      operator_delete(labels.
                      super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                      .
                      super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                      .stack.fixed._M_elems[9].currp,
                      (long)labels.
                            super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                            .
                            super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)labels.
                            super_PostWalker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                            .
                            super_Walker<wasm::LabelUtils::LabelManager,_wasm::Visitor<wasm::LabelUtils::LabelManager,_void>_>
                            .stack.fixed._M_elems[9].currp);
    }
    if (next.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(next.
                      super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)mergeable.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)next.
                            super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    bVar7 = true;
  }
LAB_006a624a:
  if (others.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(others.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)next.
                          super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)others.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return bVar7;
}

Assistant:

bool optimizeTerminatingTails(std::vector<Tail>& tails, Index num = 0) {
    if (tails.size() < 2) {
      return false;
    }
    // remove things that are untoward and cannot be optimized
    tails.erase(
      std::remove_if(tails.begin(),
                     tails.end(),
                     [&](Tail& tail) {
                       if (tail.expr && modifieds.count(tail.expr) > 0) {
                         return true;
                       }
                       if (tail.block && modifieds.count(tail.block) > 0) {
                         return true;
                       }
                       // if we were not modified, then we should be valid for
                       // processing
                       tail.validate();
                       return false;
                     }),
      tails.end());
    // now let's try to find subsets that are mergeable. we don't look hard
    // for the most optimal; further passes may find more
    // effectiveSize: TODO: special-case fallthrough, matters for returns
    auto effectiveSize = [&](Tail& tail) -> Index {
      if (tail.block) {
        return tail.block->list.size();
      } else {
        return 1;
      }
    };
    // getItem: returns the relevant item from the tail. this includes the
    //          final item
    //          TODO: special-case fallthrough, matters for returns
    auto getItem = [&](Tail& tail, Index num) {
      if (tail.block) {
        return tail.block->list[effectiveSize(tail) - num - 1];
      } else {
        return tail.expr;
      }
    };
    // gets the tail elements of a certain depth
    auto getTailItems = [&](Index num, std::vector<Tail>& tails) {
      std::vector<Expression*> items;
      for (Index i = 0; i < num; i++) {
        auto item = getItem(tails[0], i);
        items.push_back(item);
      }
      return items;
    };
    // estimate if a merging is worth the cost
    auto worthIt = [&](Index num, std::vector<Tail>& tails) {
      auto items = getTailItems(num, tails); // the elements we can merge
      Index saved = 0;                       // how much we can save
      for (auto* item : items) {
        saved += Measurer::measure(item) * (tails.size() - 1);
      }
      // compure the cost: in non-fallthroughs, we are replacing the final
      // element with a br; for a fallthrough, if there is one, we must
      // add a return element (for the function body, so it doesn't reach us)
      // TODO: handle fallthroughts for return
      Index cost = tails.size();
      // we also need to add two blocks: for us to break to, and to contain
      // that block and the merged code. very possibly one of the blocks
      // can be removed, though
      cost += WORTH_ADDING_BLOCK_TO_REMOVE_THIS_MUCH;
      // if we cannot merge to the end, then we definitely need 2 blocks,
      // and a branch
      // TODO: efficiency, entire body
      if (!canMove(items, getFunction()->body)) {
        cost += 1 + WORTH_ADDING_BLOCK_TO_REMOVE_THIS_MUCH;
        // TODO: to do this, we need to maintain a map of element=>parent,
        //       so that we can insert the new blocks in the right place
        //       for now, just don't do this optimization
        return false;
      }
      // is it worth it?
      return saved > cost;
    };
    // let's see if we can merge deeper than num, to num + 1
    auto next = tails;
    // remove tails that are too short, or that we hit an item we can't handle
    next.erase(std::remove_if(next.begin(),
                              next.end(),
                              [&](Tail& tail) {
                                if (effectiveSize(tail) < num + 1) {
                                  return true;
                                }
                                auto* newItem = getItem(tail, num);
                                // ignore tails that break to outside blocks. we
                                // want to move code to the very outermost
                                // position, so such code cannot be moved
                                // TODO: this should not be a problem in
                                //       *non*-terminating tails, but
                                //       double-verify that
                                if (EffectAnalyzer(
                                      getPassOptions(), *getModule(), newItem)
                                      .hasExternalBreakTargets()) {
                                  return true;
                                }
                                return false;
                              }),
               next.end());
    // if we have enough to investigate, do so
    if (next.size() >= 2) {
      // now we want to find a mergeable item - any item that is equal among a
      // subset
      std::map<Expression*, size_t> hashes; // expression => hash value
      // hash value => expressions with that hash
      std::map<size_t, std::vector<Expression*>> hashed;
      for (auto& tail : next) {
        auto* item = getItem(tail, num);
        auto hash = hashes[item] = ExpressionAnalyzer::hash(item);
        hashed[hash].push_back(item);
      }
      // look at each hash value exactly once. we do this in a deterministic
      // order by iterating over a vector retaining insertion order.
      std::set<size_t> seen;
      for (auto& tail : next) {
        auto* item = getItem(tail, num);
        auto digest = hashes[item];
        if (!seen.emplace(digest).second) {
          continue;
        }

        auto& items = hashed[digest];
        if (items.size() == 1) {
          continue;
        }
        assert(items.size() > 0);
        // look for an item that has another match.
        while (items.size() >= 2) {
          auto first = items[0];
          std::vector<Expression*> others;
          items.erase(
            std::remove_if(items.begin(),
                           items.end(),
                           [&](Expression* item) {
                             if (item ==
                                   first || // don't bother comparing the first
                                 ExpressionAnalyzer::equal(item, first)) {
                               // equal, keep it
                               return false;
                             } else {
                               // unequal, look at it later
                               others.push_back(item);
                               return true;
                             }
                           }),
            items.end());
          if (items.size() >= 2) {
            // possible merge here, investigate it
            auto* correct = items[0];
            auto explore = next;
            explore.erase(std::remove_if(explore.begin(),
                                         explore.end(),
                                         [&](Tail& tail) {
                                           auto* item = getItem(tail, num);
                                           return !ExpressionAnalyzer::equal(
                                             item, correct);
                                         }),
                          explore.end());
            // try to optimize this deeper tail. if we succeed, then stop here,
            // as the changes may influence us. we leave further opts to further
            // passes (as this is rare in practice, it's generally not a perf
            // issue, but TODO optimize)
            if (optimizeTerminatingTails(explore, num + 1)) {
              return true;
            }
          }
          items.swap(others);
        }
      }
    }
    // we explored deeper (higher num) options, but perhaps there
    // was nothing there while there is something we can do at this level
    // but if we are at num == 0, then we found nothing at all
    if (num == 0) {
      return false;
    }
    // if not worth it, stop
    if (!worthIt(num, tails)) {
      return false;
    }
    // this is worth doing, do it!
    auto mergeable = getTailItems(num, tails); // the elements we can merge
    // since we managed a merge, then it might open up more opportunities later
    anotherPass = true;
    Builder builder(*getModule());
    // TODO: don't create one per merge, linear in function size
    LabelUtils::LabelManager labels(getFunction());
    Name innerName = labels.getUnique("folding-inner");
    for (auto& tail : tails) {
      // remove the items we are merging / moving, and add a break
      // also mark as modified, so we don't try to handle them
      // again in this pass, which might be buggy
      if (tail.block) {
        markAsModified(tail.block);
        for (Index i = 0; i < mergeable.size(); i++) {
          tail.block->list.pop_back();
        }
        tail.block->list.push_back(builder.makeBreak(innerName));
        tail.block->finalize(tail.block->type);
      } else {
        markAsModified(tail.expr);
        *tail.pointer = builder.makeBreak(innerName);
      }
    }
    // make a block with the old body + the merged code
    auto* old = getFunction()->body;
    auto* inner = builder.makeBlock();
    inner->name = innerName;
    if (old->type == Type::unreachable) {
      // the old body is not flowed out of anyhow, so just put it there
      inner->list.push_back(old);
    } else {
      // otherwise, we must not flow out to the merged code
      if (old->type == Type::none) {
        inner->list.push_back(old);
        inner->list.push_back(builder.makeReturn());
      } else {
        // looks like we must return this. but if it's a toplevel block
        // then it might be marked as having a type, but not actually
        // returning it (we marked it as such for wasm type-checking
        // rules, and now it won't be toplevel in the function, it can
        // change)
        auto* toplevel = old->dynCast<Block>();
        if (toplevel) {
          toplevel->finalize();
        }
        if (old->type != Type::unreachable) {
          inner->list.push_back(builder.makeReturn(old));
        } else {
          inner->list.push_back(old);
        }
      }
    }
    inner->finalize();
    auto* outer = builder.makeBlock();
    outer->list.push_back(inner);
    while (!mergeable.empty()) {
      outer->list.push_back(mergeable.back());
      mergeable.pop_back();
    }
    // ensure the replacement has the same type, so the outside is not surprised
    outer->finalize(getFunction()->getResults());
    getFunction()->body = outer;
    return true;
  }